

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

size_t encodeUTF8(char *s,uint ch)

{
  byte bVar1;
  size_t local_20;
  size_t count;
  uint ch_local;
  char *s_local;
  
  local_20 = 0;
  bVar1 = (byte)ch;
  if (ch < 0x80) {
    local_20 = 1;
    *s = bVar1;
  }
  else if (ch < 0x800) {
    *s = (byte)(ch >> 6) | 0xc0;
    local_20 = 2;
    s[1] = bVar1 & 0x3f | 0x80;
  }
  else if (ch < 0x10000) {
    *s = (byte)(ch >> 0xc) | 0xe0;
    s[1] = (byte)(ch >> 6) & 0x3f | 0x80;
    local_20 = 3;
    s[2] = bVar1 & 0x3f | 0x80;
  }
  else if (ch < 0x110000) {
    *s = (byte)(ch >> 0x12) | 0xf0;
    s[1] = (byte)(ch >> 0xc) & 0x3f | 0x80;
    s[2] = (byte)(ch >> 6) & 0x3f | 0x80;
    local_20 = 4;
    s[3] = bVar1 & 0x3f | 0x80;
  }
  return local_20;
}

Assistant:

static size_t encodeUTF8(char* s, unsigned int ch)
{
    size_t count = 0;

    if (ch < 0x80)
        s[count++] = (char) ch;
    else if (ch < 0x800)
    {
        s[count++] = (ch >> 6) | 0xc0;
        s[count++] = (ch & 0x3f) | 0x80;
    }
    else if (ch < 0x10000)
    {
        s[count++] = (ch >> 12) | 0xe0;
        s[count++] = ((ch >> 6) & 0x3f) | 0x80;
        s[count++] = (ch & 0x3f) | 0x80;
    }
    else if (ch < 0x110000)
    {
        s[count++] = (ch >> 18) | 0xf0;
        s[count++] = ((ch >> 12) & 0x3f) | 0x80;
        s[count++] = ((ch >> 6) & 0x3f) | 0x80;
        s[count++] = (ch & 0x3f) | 0x80;
    }

    return count;
}